

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.cpp
# Opt level: O2

void __thiscall Js::ScriptContextProfiler::ProfilePrint(ScriptContextProfiler *this)

{
  Phase PVar1;
  ScriptContextProfiler *profiler;
  
  if (DAT_0145948a == '\0') {
    for (; this != (ScriptContextProfiler *)0x0; this = this->next) {
      profiler = this;
      if (this->profilerArena != (ArenaAllocator *)0x0) {
        while (profiler = profiler->next, profiler != (ScriptContextProfiler *)0x0) {
          if (profiler->profilerArena != (ArenaAllocator *)0x0) {
            ProfileMerge(this,profiler);
          }
        }
        PVar1 = Phases::GetFirstPhase((Phases *)&DAT_0144aab0);
        ProfilePrint(this,PVar1);
        return;
      }
    }
  }
  else {
    for (; this != (ScriptContextProfiler *)0x0; this = this->next) {
      PVar1 = Phases::GetFirstPhase((Phases *)&DAT_0144aab0);
      ProfilePrint(this,PVar1);
    }
  }
  return;
}

Assistant:

void
    ScriptContextProfiler::ProfilePrint()
    {
        Js::ScriptContextProfiler* profiler = this;
        if (Js::Configuration::Global.flags.Verbose)
        {
            //Print individual profiler information in verbose mode
            while (profiler)
            {
                profiler->ProfilePrint(Js::Configuration::Global.flags.Profile.GetFirstPhase());
                profiler = profiler->next;
            }
        }
        else
        {
            //Merge all the profiler for single snapshot.
            Js::ScriptContextProfiler* mergeToProfiler = profiler;

            // find the first initialized profiler
            while (mergeToProfiler != nullptr && !mergeToProfiler->IsInitialized())
            {
                mergeToProfiler = mergeToProfiler->next;
            }
            if (mergeToProfiler != nullptr)
            {
                // merge the rest profiler to the above initialized profiler
                profiler = mergeToProfiler->next;
                while (profiler)
                {
                    if (profiler->IsInitialized())
                    {
                        mergeToProfiler->ProfileMerge(profiler);
                    }
                    profiler = profiler->next;
                }
                mergeToProfiler->ProfilePrint(Js::Configuration::Global.flags.Profile.GetFirstPhase());
            }
        }
    }